

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O0

FT_Byte * tt_face_get_device_metrics(TT_Face face,FT_UInt ppem,FT_UInt gindex)

{
  FT_Byte *record;
  FT_ULong record_size;
  FT_Byte *result;
  FT_UInt nn;
  FT_UInt gindex_local;
  FT_UInt ppem_local;
  TT_Face face_local;
  
  result._4_4_ = 0;
  while( true ) {
    if (face->hdmx_record_count <= result._4_4_) {
      return (FT_Byte *)0x0;
    }
    if (face->hdmx_record_sizes[result._4_4_] == ppem) break;
    result._4_4_ = result._4_4_ + 1;
  }
  if (face->hdmx_record_size <= (ulong)(gindex + 2)) {
    return (FT_Byte *)0x0;
  }
  return face->hdmx_table + (ulong)(gindex + 2) + (ulong)result._4_4_ * face->hdmx_record_size + 8;
}

Assistant:

FT_LOCAL_DEF( FT_Byte* )
  tt_face_get_device_metrics( TT_Face  face,
                              FT_UInt  ppem,
                              FT_UInt  gindex )
  {
    FT_UInt   nn;
    FT_Byte*  result      = NULL;
    FT_ULong  record_size = face->hdmx_record_size;
    FT_Byte*  record      = face->hdmx_table + 8;


    for ( nn = 0; nn < face->hdmx_record_count; nn++ )
      if ( face->hdmx_record_sizes[nn] == ppem )
      {
        gindex += 2;
        if ( gindex < record_size )
          result = record + nn * record_size + gindex;
        break;
      }

    return result;
  }